

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int32_t iVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  bool bVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint end_00;
  uint uVar28;
  long lVar29;
  uint start_00;
  ulong uVar30;
  int *piVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  
  uVar30 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar24 = end_00 - start;
    if (0x18 < (int)uVar24) {
LAB_00438925:
      start_00 = (uint)uVar30;
      iVar25 = (uVar24 >> 1) + start_00;
      pNVar1 = keys + iVar25;
      iVar25 = keys[iVar25].idx;
      lVar26 = (long)(int)start_00;
      lVar27 = -(long)(int)end_00;
      uVar36 = uVar30;
      uVar24 = end_00;
LAB_0043898a:
      iVar34 = (int)uVar36;
      if ((type & 1U) != 0) {
        if (iVar34 < (int)end_00) {
          piVar31 = &keys[iVar34].idx;
          lVar29 = 0;
          do {
            bVar23 = EQ(*piVar31,iVar25);
            if ((bVar23) || (iVar25 <= *piVar31)) {
              uVar35 = iVar34 - (int)lVar29;
              break;
            }
            lVar29 = lVar29 + -1;
            piVar31 = piVar31 + 0x15;
            uVar35 = end_00;
          } while (iVar34 + lVar27 != lVar29);
          uVar36 = (ulong)uVar35;
        }
        if ((int)uVar24 <= (int)start_00) goto LAB_00438aea;
        uVar35 = (uint)uVar36;
        lVar29 = (long)(int)uVar24;
        piVar31 = &keys[lVar29].idx;
        do {
          bVar23 = EQ(*piVar31,iVar25);
          if ((!bVar23) && (*piVar31 < iVar25)) goto LAB_00438adb;
          lVar29 = lVar29 + -1;
          piVar31 = piVar31 + -0x15;
          uVar24 = start_00;
        } while (lVar26 < lVar29);
        goto LAB_00438ae3;
      }
      if (iVar34 < (int)end_00) {
        piVar31 = &keys[iVar34].idx;
        lVar29 = 0;
        do {
          bVar23 = EQ(*piVar31,iVar25);
          if ((!bVar23) && (iVar25 <= *piVar31)) {
            uVar35 = iVar34 - (int)lVar29;
            break;
          }
          lVar29 = lVar29 + -1;
          piVar31 = piVar31 + 0x15;
          uVar35 = end_00;
        } while (iVar34 + lVar27 != lVar29);
        uVar36 = (ulong)uVar35;
      }
      if ((int)start_00 < (int)uVar24) {
        uVar35 = (uint)uVar36;
        lVar29 = (long)(int)uVar24;
        piVar31 = &keys[lVar29].idx;
        do {
          bVar23 = EQ(*piVar31,iVar25);
          if ((bVar23) || (*piVar31 < iVar25)) goto LAB_00438adb;
          lVar29 = lVar29 + -1;
          piVar31 = piVar31 + -0x15;
          uVar24 = start_00;
        } while (lVar26 < lVar29);
        goto LAB_00438ae3;
      }
      goto LAB_00438aea;
    }
LAB_00438ece:
    if (0 < (int)uVar24) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,end_00,compare,start);
      return;
    }
  }
  return;
LAB_00438adb:
  uVar24 = (uint)lVar29;
LAB_00438ae3:
  uVar36 = (ulong)uVar35;
LAB_00438aea:
  iVar34 = (int)uVar36;
  if ((int)uVar24 <= iVar34) goto LAB_00438be0;
  uVar5 = *(undefined8 *)keys[iVar34].val.m_backend.data._M_elems;
  uVar6 = *(undefined8 *)(keys[iVar34].val.m_backend.data._M_elems + 2);
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 4;
  uVar7 = *(undefined8 *)puVar2;
  uVar8 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 8;
  uVar9 = *(undefined8 *)puVar2;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 0xc;
  uVar11 = *(undefined8 *)puVar2;
  uVar12 = *(undefined8 *)(puVar2 + 2);
  iVar3 = keys[iVar34].val.m_backend.exp;
  bVar23 = keys[iVar34].val.m_backend.neg;
  iVar4 = keys[iVar34].idx;
  uVar13 = *(undefined8 *)(keys[(int)uVar24].val.m_backend.data._M_elems + 2);
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 4;
  uVar14 = *(undefined8 *)puVar2;
  uVar15 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 8;
  uVar16 = *(undefined8 *)puVar2;
  uVar17 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 0xc;
  uVar18 = *(undefined8 *)puVar2;
  uVar19 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)keys[iVar34].val.m_backend.data._M_elems =
       *(undefined8 *)keys[(int)uVar24].val.m_backend.data._M_elems;
  *(undefined8 *)(keys[iVar34].val.m_backend.data._M_elems + 2) = uVar13;
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar14;
  *(undefined8 *)(puVar2 + 2) = uVar15;
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = uVar16;
  *(undefined8 *)(puVar2 + 2) = uVar17;
  puVar2 = keys[iVar34].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = uVar18;
  *(undefined8 *)(puVar2 + 2) = uVar19;
  keys[iVar34].val.m_backend.exp = keys[(int)uVar24].val.m_backend.exp;
  keys[iVar34].val.m_backend.neg = keys[(int)uVar24].val.m_backend.neg;
  keys[iVar34].idx = keys[(int)uVar24].idx;
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = uVar11;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = uVar9;
  *(undefined8 *)(puVar2 + 2) = uVar10;
  puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar7;
  *(undefined8 *)(puVar2 + 2) = uVar8;
  *(undefined8 *)keys[(int)uVar24].val.m_backend.data._M_elems = uVar5;
  *(undefined8 *)(keys[(int)uVar24].val.m_backend.data._M_elems + 2) = uVar6;
  keys[(int)uVar24].val.m_backend.exp = iVar3;
  keys[(int)uVar24].val.m_backend.neg = bVar23;
  fVar21 = keys[iVar34].val.m_backend.fpclass;
  iVar22 = keys[iVar34].val.m_backend.prec_elem;
  iVar20 = keys[(int)uVar24].val.m_backend.prec_elem;
  keys[iVar34].val.m_backend.fpclass = keys[(int)uVar24].val.m_backend.fpclass;
  keys[iVar34].val.m_backend.prec_elem = iVar20;
  keys[(int)uVar24].val.m_backend.fpclass = fVar21;
  keys[(int)uVar24].val.m_backend.prec_elem = iVar22;
  keys[(int)uVar24].idx = iVar4;
  uVar36 = (ulong)(iVar34 + 1);
  uVar24 = uVar24 - 1;
  goto LAB_0043898a;
LAB_00438be0:
  if ((type & 1U) == 0) {
    if ((int)start_00 < (int)uVar24) {
      uVar32 = (ulong)(int)uVar24;
      piVar31 = &keys[uVar32].idx;
      do {
        bVar23 = EQ(iVar25,*piVar31);
        if ((!bVar23) && (uVar33 = uVar32, *piVar31 <= iVar25)) break;
        uVar32 = uVar32 - 1;
        piVar31 = piVar31 + -0x15;
        uVar33 = uVar30;
      } while (lVar26 < (long)uVar32);
      uVar24 = (uint)uVar33;
    }
    if (uVar24 == end_00) {
      uVar5 = *(undefined8 *)keys[(int)uVar24].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[(int)uVar24].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar25 = keys[(int)uVar24].val.m_backend.exp;
      bVar23 = keys[(int)uVar24].val.m_backend.neg;
      iVar34 = keys[(int)uVar24].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar24].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar24].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar24].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[(int)uVar24].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar24].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar24].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar25;
      (pNVar1->val).m_backend.neg = bVar23;
      fVar21 = keys[(int)uVar24].val.m_backend.fpclass;
      iVar22 = keys[(int)uVar24].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar24].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar24].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar34;
      uVar24 = uVar24 - 1;
    }
  }
  else {
    if (iVar34 < (int)end_00) {
      piVar31 = &keys[iVar34].idx;
      lVar26 = 0;
      do {
        bVar23 = EQ(iVar25,*piVar31);
        if ((!bVar23) && (iVar25 < *piVar31)) {
          uVar35 = iVar34 - (int)lVar26;
          break;
        }
        lVar26 = lVar26 + -1;
        piVar31 = piVar31 + 0x15;
        uVar35 = end_00;
      } while ((long)iVar34 - (long)(int)end_00 != lVar26);
      uVar36 = (ulong)uVar35;
    }
    uVar35 = (uint)uVar36;
    if (uVar35 == start_00) {
      uVar5 = *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar25 = keys[(int)uVar35].val.m_backend.exp;
      bVar23 = keys[(int)uVar35].val.m_backend.neg;
      iVar34 = keys[(int)uVar35].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar35].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[(int)uVar35].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar35].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar35].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar25;
      (pNVar1->val).m_backend.neg = bVar23;
      fVar21 = keys[(int)uVar35].val.m_backend.fpclass;
      iVar22 = keys[(int)uVar35].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar35].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar35].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar34;
      uVar36 = (ulong)(uVar35 + 1);
    }
  }
  uVar35 = (uint)uVar36;
  if ((int)(end_00 - uVar35) < (int)(uVar24 - start_00)) {
    uVar36 = uVar30;
    uVar28 = uVar24;
    uVar24 = end_00;
    start_00 = uVar35;
    if ((int)end_00 <= (int)uVar35) goto LAB_00438eb4;
  }
  else {
    uVar30 = uVar36;
    uVar28 = end_00;
    if ((int)uVar24 <= (int)start_00) goto LAB_00438eb4;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar24 + 1,compare,start_00,(bool)(~type & 1));
  uVar30 = uVar36;
LAB_00438eb4:
  end_00 = uVar28;
  type = (bool)(type ^ 1);
  start = (int)uVar30;
  uVar24 = end_00 - start;
  if ((int)uVar24 < 0x19) goto LAB_00438ece;
  goto LAB_00438925;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}